

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::draw(Player *this,int i)

{
  size_type sVar1;
  reference ppAVar2;
  value_type local_28;
  AEntity *tmp_1;
  AEntity *tmp;
  int j;
  int i_local;
  Player *this_local;
  
  tmp._4_4_ = i;
  _j = this;
  for (tmp._0_4_ = 0; (int)tmp < tmp._4_4_; tmp._0_4_ = (int)tmp + 1) {
    sVar1 = std::vector<AEntity_*,_std::allocator<AEntity_*>_>::size(&this->_deck);
    if (sVar1 == 0) {
      sVar1 = std::vector<AEntity_*,_std::allocator<AEntity_*>_>::size(&this->_deck);
      if (sVar1 == 10) {
        ppAVar2 = std::vector<AEntity_*,_std::allocator<AEntity_*>_>::back(&this->_deck);
        local_28 = *ppAVar2;
        std::vector<AEntity_*,_std::allocator<AEntity_*>_>::push_back(&this->_played,&local_28);
        std::vector<AEntity_*,_std::allocator<AEntity_*>_>::pop_back(&this->_deck);
      }
    }
    else {
      ppAVar2 = std::vector<AEntity_*,_std::allocator<AEntity_*>_>::back(&this->_deck);
      tmp_1 = *ppAVar2;
      std::vector<AEntity_*,_std::allocator<AEntity_*>_>::push_back(&this->_hands,&tmp_1);
      std::vector<AEntity_*,_std::allocator<AEntity_*>_>::pop_back(&this->_deck);
    }
  }
  return;
}

Assistant:

void Player::draw(int i) {
    for (int j = 0; j < i; ++j) {
        if (this->_deck.size()) {
            AEntity *tmp = this->_deck.back();
            this->_hands.push_back(tmp);
            this->_deck.pop_back();
        } else if (this->_deck.size() == 10) {
            AEntity *tmp = this->_deck.back();
            this->_played.push_back(tmp);
            this->_deck.pop_back();
        } else {
            //todo: gestion de la fatigue
        }
    }
}